

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void ParseOptions(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  char *msg;
  int iVar6;
  long *local_88;
  undefined8 uStack_80;
  long local_78 [2];
  long *local_68;
  undefined8 uStack_60;
  long local_58 [2];
  bool local_48;
  bool bStack_47;
  undefined1 uStack_46;
  ulong local_38;
  
  local_78[1] = 0;
  local_58[1] = 0;
  _local_48 = 0;
  local_68 = local_58;
  uStack_80 = 0;
  local_78[0] = 0;
  uStack_60 = 0;
  local_58[0] = 0;
  local_88 = local_78;
  std::__cxx11::string::operator=((string *)&g_options,(string *)&local_88);
  std::__cxx11::string::operator=((string *)&g_options.input_file,(string *)&local_68);
  uVar4 = _local_48;
  g_options.gc_stress = local_48;
  g_options.heap_verify = bStack_47;
  uStack_46 = SUB81(uVar4,2);
  g_options.emit_warnings = (bool)uStack_46;
  _local_48 = uVar4;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (1 < argc) {
    iVar6 = 1;
    local_38 = 0;
    do {
      pcVar1 = argv[iVar6];
      iVar3 = strcmp("-h",pcVar1);
      if ((iVar3 == 0) || (iVar3 = strcmp("--help",pcVar1), iVar3 == 0)) {
        poVar5 = std::operator<<((ostream *)&std::cout,usage);
        std::endl<char,std::char_traits<char>>(poVar5);
        exit(0);
      }
      msg = "-s";
      iVar3 = strcmp("-s",pcVar1);
      if (iVar3 == 0) {
LAB_0011c6ff:
        sVar2 = g_options.stdlib_path._M_string_length;
        iVar3 = iVar6 + 1;
        if (argc <= iVar3) {
          ParseError(msg);
        }
        iVar6 = iVar6 + 2;
        pcVar1 = argv[iVar3];
        strlen(pcVar1);
        std::__cxx11::string::_M_replace(0x127f70,0,(char *)sVar2,(ulong)pcVar1);
      }
      else {
        msg = "--stdlib-path";
        iVar3 = strcmp("--stdlib-path",pcVar1);
        if (iVar3 == 0) goto LAB_0011c6ff;
        iVar3 = strcmp("-w",pcVar1);
        if ((iVar3 == 0) || (iVar3 = strcmp("--warnings",pcVar1), iVar3 == 0)) {
          iVar6 = iVar6 + 1;
          g_options.emit_warnings = true;
        }
        else {
          iVar3 = strcmp("--gc-stress",pcVar1);
          if (iVar3 == 0) {
            iVar6 = iVar6 + 1;
            g_options.gc_stress = true;
          }
          else {
            iVar3 = strcmp("--heap-verify",pcVar1);
            sVar2 = g_options.input_file._M_string_length;
            if (iVar3 == 0) {
              iVar6 = iVar6 + 1;
              g_options.heap_verify = true;
            }
            else {
              if ((local_38 & 1) != 0) {
                poVar5 = std::operator<<((ostream *)&std::cout,"unexpected positional argument: ");
                poVar5 = std::operator<<(poVar5,argv[iVar6]);
                std::endl<char,std::char_traits<char>>(poVar5);
                exit(1);
              }
              iVar6 = iVar6 + 1;
              strlen(pcVar1);
              uVar4 = std::__cxx11::string::_M_replace(0x127f90,0,(char *)sVar2,(ulong)pcVar1);
              local_38 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
          }
        }
      }
    } while (iVar6 < argc);
  }
  return;
}

Assistant:

void ParseOptions(int argc, char **argv) {
  g_options = Options();
  int i = 1;
  bool seen_input_file = false;
  while (i < argc) {
    if (strcmp("-h", argv[i]) == 0 || strcmp("--help", argv[i]) == 0) {
      std::cout << usage << std::endl;
      std::exit(0);
    }

    if (strcmp("-s", argv[i]) == 0 || strcmp("--stdlib-path", argv[i]) == 0) {
      i++;
      if (i >= argc) {
        ParseError("expected argument for standard library path");
      }

      g_options.stdlib_path = argv[i++];
      continue;
    }

    if (strcmp("-w", argv[i]) == 0 || strcmp("--warnings", argv[i]) == 0) {
      i++;
      g_options.emit_warnings = true;
      continue;
    }

    if (strcmp("--gc-stress", argv[i]) == 0) {
      i++;
      g_options.gc_stress = true;
      continue;
    }

    if (strcmp("--heap-verify", argv[i]) == 0) {
      i++;
      g_options.heap_verify = true;
      continue;
    }

    if (!seen_input_file) {
      seen_input_file = true;
      g_options.input_file = argv[i++];
    } else {
      std::cout << "unexpected positional argument: " << argv[i] << std::endl;
      std::exit(1);
    }
  }
}